

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_bounds.h
# Opt level: O0

PreprocessInfoStd * __thiscall
mp::
BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ComputeBoundsAndType
          (BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,LinTerms *lt)

{
  bool bVar1;
  Type TVar2;
  size_t sVar3;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RSI;
  PreprocessInfo<int> *in_RDI;
  FlatModel<mp::DefaultFlatModelParams> *this_00;
  double dVar4;
  PreprocessInfoStd *result;
  double c;
  int v;
  size_t i;
  ModelType *model;
  FlatModel<mp::DefaultFlatModelParams> *in_stack_ffffffffffffff98;
  FlatModel<mp::DefaultFlatModelParams> *in_stack_ffffffffffffffa0;
  size_t local_20;
  
  PreprocessInfo<int>::PreprocessInfo(in_RDI);
  in_RDI->ub_ = 0.0;
  in_RDI->lb_ = 0.0;
  in_RDI->type_ = INTEGER;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::GetModel(in_RSI);
  local_20 = LinTerms::size((LinTerms *)0x19c6fe);
  while (sVar3 = local_20 - 1, local_20 != 0) {
    LinTerms::var((LinTerms *)in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
    this_00 = (FlatModel<mp::DefaultFlatModelParams> *)
              LinTerms::coef((LinTerms *)in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98
                            );
    if ((double)this_00 < 0.0) {
      in_stack_ffffffffffffff98 = this_00;
      dVar4 = FlatModel<mp::DefaultFlatModelParams>::ub
                        (in_stack_ffffffffffffffa0,(Var)((ulong)this_00 >> 0x20));
      in_RDI->lb_ = (double)in_stack_ffffffffffffff98 * dVar4 + in_RDI->lb_;
      dVar4 = FlatModel<mp::DefaultFlatModelParams>::lb
                        (this_00,(Var)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      in_RDI->ub_ = (double)this_00 * dVar4 + in_RDI->ub_;
      in_stack_ffffffffffffffa0 = this_00;
    }
    else {
      dVar4 = FlatModel<mp::DefaultFlatModelParams>::lb
                        (in_stack_ffffffffffffffa0,(Var)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      in_RDI->lb_ = (double)this_00 * dVar4 + in_RDI->lb_;
      dVar4 = FlatModel<mp::DefaultFlatModelParams>::ub
                        (in_stack_ffffffffffffffa0,(Var)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      in_RDI->ub_ = (double)this_00 * dVar4 + in_RDI->ub_;
    }
    TVar2 = FlatModel<mp::DefaultFlatModelParams>::var_type
                      (in_stack_ffffffffffffffa0,(Var)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    local_20 = sVar3;
    if ((TVar2 != INTEGER) ||
       (bVar1 = is_integer<double>((double)in_stack_ffffffffffffffa0), !bVar1)) {
      in_RDI->type_ = CONTINUOUS;
    }
  }
  return in_RDI;
}

Assistant:

PreprocessInfoStd ComputeBoundsAndType(const LinTerms& lt)
      const {
    PreprocessInfoStd result;
    result.lb_ = result.ub_ = 0.0;
    result.type_ = var::INTEGER;
    auto& model = MPCD( GetModel() );
    for (auto i=lt.size(); i--; ) {
      auto v = lt.var(i);
      auto c = lt.coef(i);
      if (c >= 0.0) {
        result.lb_ += c * model.lb(v);
        result.ub_ += c * model.ub(v);
      } else {
        result.lb_ += c * model.ub(v);
        result.ub_ += c * model.lb(v);
      }
      if (var::INTEGER!=model.var_type(v)
          || !is_integer(c)) {
        result.type_=var::CONTINUOUS;
      }
    }
    return result;
  }